

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O1

uint8_t * __thiscall
CoreML::Specification::TreeEnsembleClassifier::_InternalSerialize
          (TreeEnsembleClassifier *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  TreeEnsembleParameters *this_00;
  StringVector *this_01;
  Int64Vector *this_02;
  void *data;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint8_t *puVar6;
  undefined8 *puVar7;
  size_t __n;
  
  if ((this != (TreeEnsembleClassifier *)_TreeEnsembleClassifier_default_instance_) &&
     (this->treeensemble_ != (TreeEnsembleParameters *)0x0)) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_00 = this->treeensemble_;
    *target = '\n';
    uVar1 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar6 = target + 2;
    }
    else {
      puVar6 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar1,target + 1);
    }
    target = TreeEnsembleParameters::_InternalSerialize(this_00,puVar6,stream);
  }
  puVar6 = target;
  if (this->postevaluationtransform_ != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar1 = this->postevaluationtransform_;
    *target = '\x10';
    target[1] = (byte)uVar1;
    if ((ulong)(long)(int)uVar1 < 0x80) {
      puVar6 = target + 2;
    }
    else {
      target[1] = (byte)uVar1 | 0x80;
      uVar3 = (ulong)(long)(int)uVar1 >> 7;
      target[2] = (uint8_t)uVar3;
      puVar6 = target + 3;
      if (0x3fff < uVar1) {
        uVar5 = (ulong)target[2];
        do {
          puVar6[-1] = (byte)uVar5 | 0x80;
          uVar4 = uVar3 >> 7;
          *puVar6 = (uint8_t)uVar4;
          puVar6 = puVar6 + 1;
          uVar5 = uVar4 & 0xffffffff;
          bVar2 = 0x3fff < uVar3;
          uVar3 = uVar4;
        } while (bVar2);
      }
    }
  }
  if (this->_oneof_case_[0] == 100) {
    if (stream->end_ <= puVar6) {
      puVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar6);
    }
    this_01 = (this->ClassLabels_).stringclasslabels_;
    puVar6[0] = 0xa2;
    puVar6[1] = '\x06';
    uVar1 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
    puVar6[2] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar6 = puVar6 + 3;
    }
    else {
      puVar6 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar1,puVar6 + 2);
    }
    puVar6 = StringVector::_InternalSerialize(this_01,puVar6,stream);
  }
  if (this->_oneof_case_[0] == 0x65) {
    if (stream->end_ <= puVar6) {
      puVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar6);
    }
    this_02 = (this->ClassLabels_).int64classlabels_;
    puVar6[0] = 0xaa;
    puVar6[1] = '\x06';
    uVar1 = (this_02->_cached_size_).size_.super___atomic_base<int>._M_i;
    puVar6[2] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar6 = puVar6 + 3;
    }
    else {
      puVar6 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar1,puVar6 + 2);
    }
    puVar6 = Int64Vector::_InternalSerialize(this_02,puVar6,stream);
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    data = *(void **)((uVar3 & 0xfffffffffffffffc) + 8);
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar3 & 1) == 0) {
      puVar7 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar7 = (undefined8 *)((uVar3 & 0xfffffffffffffffc) + 8);
    }
    __n = (size_t)(int)puVar7[1];
    if ((long)stream->end_ - (long)puVar6 < (long)__n) {
      puVar6 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,data,(int)puVar7[1],puVar6);
      return puVar6;
    }
    memcpy(puVar6,data,__n);
    puVar6 = puVar6 + __n;
  }
  return puVar6;
}

Assistant:

uint8_t* TreeEnsembleClassifier::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.TreeEnsembleClassifier)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.TreeEnsembleParameters treeEnsemble = 1;
  if (this->_internal_has_treeensemble()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        1, _Internal::treeensemble(this), target, stream);
  }

  // .CoreML.Specification.TreeEnsemblePostEvaluationTransform postEvaluationTransform = 2;
  if (this->_internal_postevaluationtransform() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      2, this->_internal_postevaluationtransform(), target);
  }

  // .CoreML.Specification.StringVector stringClassLabels = 100;
  if (_internal_has_stringclasslabels()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        100, _Internal::stringclasslabels(this), target, stream);
  }

  // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
  if (_internal_has_int64classlabels()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        101, _Internal::int64classlabels(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.TreeEnsembleClassifier)
  return target;
}